

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O1

void finish_setup(nn *n,vw *all)

{
  features *this;
  size_t *psVar1;
  ulong uVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar3;
  uint32_t *puVar4;
  ulong uVar5;
  feature_index i;
  stringstream ss;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  undefined1 local_1a8 [376];
  
  memset(&n->output_layer,0,0x68d0);
  v_array<unsigned_char>::push_back((v_array<unsigned_char> *)&n->output_layer,&nn_output_namespace)
  ;
  puVar4 = &(all->weights).dense_weights._stride_shift;
  if ((all->weights).sparse != false) {
    puVar4 = &(all->weights).sparse_weights._stride_shift;
  }
  i = 0x1fca64ebL << ((byte)*puVar4 & 0x3f);
  this = (n->output_layer).super_example_predict.feature_space + 0x81;
  uVar2 = (ulong)n->k;
  if (n->k != 0) {
    local_1e0 = &(n->output_layer).super_example_predict.feature_space[0x81].space_names;
    uVar5 = 0;
    do {
      features::push_back(this,1.0,i);
      if ((all->audit != false) || (all->hash_inv == true)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"OutputLayer",0xb);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        ppVar3 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)operator_new(0x40);
        std::__cxx11::stringbuf::str();
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<const_char_(&)[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (ppVar3,(char (*) [1])0x27b199,&local_1d8);
        local_1f0.
        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = ppVar3;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<std::pair<std::__cxx11::string,std::__cxx11::string>*>
                  (&local_1f0.
                    super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,ppVar3);
        v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back(local_1e0,&local_1f0);
        if (local_1f0.
            super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1f0.
                     super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      }
      i = i + n->increment;
      uVar5 = uVar5 + 1;
      uVar2 = (ulong)n->k;
    } while (uVar5 < uVar2);
  }
  psVar1 = &(n->output_layer).num_features;
  *psVar1 = *psVar1 + uVar2;
  if (n->inpass == false) {
    features::push_back(this,1.0,i);
    if ((all->audit != false) || (all->hash_inv == true)) {
      ppVar3 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)operator_new(0x40);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[1],_const_char_(&)[17],_true>
                (ppVar3,(char (*) [1])0x27b199,(char (*) [17])"OutputLayerConst");
      local_1b8.
      super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = ppVar3;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::pair<std::__cxx11::string,std::__cxx11::string>*>
                (&local_1b8.
                  super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,ppVar3);
      v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back(&(n->output_layer).super_example_predict.feature_space[0x81].space_names,
                  &local_1b8);
      if (local_1b8.
          super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1b8.
                   super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
    psVar1 = &(n->output_layer).num_features;
    *psVar1 = *psVar1 + 1;
  }
  (n->output_layer).in_use = true;
  memset(&n->hiddenbias,0,0x68d0);
  v_array<unsigned_char>::push_back((v_array<unsigned_char> *)&n->hiddenbias,&constant_namespace);
  features::push_back((n->hiddenbias).super_example_predict.feature_space + 0x80,1.0,0xb1c55c);
  if ((all->audit != false) || (all->hash_inv == true)) {
    ppVar3 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)operator_new(0x40);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[1],_const_char_(&)[11],_true>
              (ppVar3,(char (*) [1])0x27b199,(char (*) [11])"HiddenBias");
    local_1b8.
    super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = ppVar3;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<std::pair<std::__cxx11::string,std::__cxx11::string>*>
              (&local_1b8.
                super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,ppVar3);
    v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(&(n->hiddenbias).super_example_predict.feature_space[0x80].space_names,&local_1b8);
    if (local_1b8.
        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b8.
                 super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  (n->hiddenbias).total_sum_feat_sq = (n->hiddenbias).total_sum_feat_sq + 1.0;
  (n->hiddenbias).l.multi.label = 0x7f7fffff;
  (n->hiddenbias).weight = 1.0;
  (n->hiddenbias).in_use = true;
  memset(&n->outputweight,0,0x68d0);
  v_array<unsigned_char>::push_back((v_array<unsigned_char> *)&n->outputweight,&nn_output_namespace)
  ;
  features::push_back((n->outputweight).super_example_predict.feature_space + 0x81,
                      *(n->output_layer).super_example_predict.feature_space[0x81].values._begin,
                      *(n->output_layer).super_example_predict.feature_space[0x81].indicies._begin);
  if ((all->audit != false) || (all->hash_inv == true)) {
    ppVar3 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)operator_new(0x40);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[1],_const_char_(&)[13],_true>
              (ppVar3,(char (*) [1])0x27b199,(char (*) [13])"OutputWeight");
    local_1b8.
    super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = ppVar3;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<std::pair<std::__cxx11::string,std::__cxx11::string>*>
              (&local_1b8.
                super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,ppVar3);
    v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(&(n->outputweight).super_example_predict.feature_space[0x81].space_names,&local_1b8)
    ;
    if (local_1b8.
        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b8.
                 super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  *(n->outputweight).super_example_predict.feature_space[0x81].values._begin = 1.0;
  (n->outputweight).total_sum_feat_sq = (n->outputweight).total_sum_feat_sq + 1.0;
  (n->outputweight).l.multi.label = 0x7f7fffff;
  (n->outputweight).weight = 1.0;
  (n->outputweight).in_use = true;
  n->finished_setup = true;
  return;
}

Assistant:

void finish_setup(nn& n, vw& all)
{
  // TODO: output_layer audit

  memset(&n.output_layer, 0, sizeof(n.output_layer));
  n.output_layer.indices.push_back(nn_output_namespace);
  uint64_t nn_index = nn_constant << all.weights.stride_shift();

  features& fs = n.output_layer.feature_space[nn_output_namespace];
  for (unsigned int i = 0; i < n.k; ++i)
  {
    fs.push_back(1., nn_index);
    if (all.audit || all.hash_inv)
    {
      std::stringstream ss;
      ss << "OutputLayer" << i;
      fs.space_names.push_back(audit_strings_ptr(new audit_strings("", ss.str())));
    }
    nn_index += (uint64_t)n.increment;
  }
  n.output_layer.num_features += n.k;

  if (!n.inpass)
  {
    fs.push_back(1., nn_index);
    if (all.audit || all.hash_inv)
      fs.space_names.push_back(audit_strings_ptr(new audit_strings("", "OutputLayerConst")));
    ++n.output_layer.num_features;
  }

  n.output_layer.in_use = true;

  // TODO: not correct if --noconstant
  memset(&n.hiddenbias, 0, sizeof(n.hiddenbias));
  n.hiddenbias.indices.push_back(constant_namespace);
  n.hiddenbias.feature_space[constant_namespace].push_back(1, (uint64_t)constant);
  if (all.audit || all.hash_inv)
    n.hiddenbias.feature_space[constant_namespace].space_names.push_back(
        audit_strings_ptr(new audit_strings("", "HiddenBias")));
  n.hiddenbias.total_sum_feat_sq++;
  n.hiddenbias.l.simple.label = FLT_MAX;
  n.hiddenbias.weight = 1;
  n.hiddenbias.in_use = true;

  memset(&n.outputweight, 0, sizeof(n.outputweight));
  n.outputweight.indices.push_back(nn_output_namespace);
  features& outfs = n.output_layer.feature_space[nn_output_namespace];
  n.outputweight.feature_space[nn_output_namespace].push_back(outfs.values[0], outfs.indicies[0]);
  if (all.audit || all.hash_inv)
    n.outputweight.feature_space[nn_output_namespace].space_names.push_back(
        audit_strings_ptr(new audit_strings("", "OutputWeight")));
  n.outputweight.feature_space[nn_output_namespace].values[0] = 1;
  n.outputweight.total_sum_feat_sq++;
  n.outputweight.l.simple.label = FLT_MAX;
  n.outputweight.weight = 1;
  n.outputweight.in_use = true;

  n.finished_setup = true;
}